

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::RgbaInputFile::FromYca::readPixels(FromYca *this,int scanLine)

{
  char *pcVar1;
  ostream *poVar2;
  ArgExc *this_00;
  Rgba *pRVar3;
  Rgba *pRVar4;
  uint d;
  Rgba **ppRVar5;
  undefined8 *puVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int y;
  stringstream _iex_throw_s;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  if (this->_fbBase == (Rgba *)0x0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               "No frame buffer was specified as the pixel data destination for image file \"",0x4c)
    ;
    pcVar1 = InputPart::fileName(this->_inputPart);
    poVar2 = std::operator<<(local_1a8,pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\".",2);
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,local_1b8);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iVar9 = this->_currentScanLine;
  d = scanLine - iVar9;
  uVar12 = -d;
  uVar8 = d;
  if ((int)d < 1) {
    uVar8 = uVar12;
  }
  if (uVar8 < 0x1d) {
    rotateBuf1(this,d);
  }
  if (uVar8 < 3) {
    rotateBuf2(this,d);
  }
  if ((int)d < 0) {
    uVar8 = 0x1d;
    if ((int)uVar12 < 0x1d) {
      uVar8 = uVar12;
    }
    iVar9 = uVar8 + 1;
    ppRVar5 = this->_buf1 + (uVar8 - 1);
    do {
      readYCAScanLine(this,iVar9 + scanLine + -0x10,*ppRVar5);
      iVar9 = iVar9 + -1;
      ppRVar5 = ppRVar5 + -1;
    } while (1 < iVar9);
    uVar8 = 3;
    if ((int)uVar12 < 3) {
      uVar8 = uVar12;
    }
    ppRVar5 = this->_buf1;
    uVar7 = 1;
    if (1 < (int)uVar8) {
      uVar7 = (ulong)uVar8;
    }
    uVar11 = 0;
    do {
      if (((int)uVar11 + scanLine & 1U) == 0) {
        RgbaYca::reconstructChromaVert(this->_width,ppRVar5,this->_buf2[uVar11]);
        iVar9 = this->_width;
        pRVar3 = this->_buf2[uVar11];
        pRVar4 = pRVar3;
      }
      else {
        iVar9 = this->_width;
        pRVar4 = this->_buf1[uVar11 + 0xd];
        pRVar3 = this->_buf2[uVar11];
      }
      RgbaYca::YCAtoRGBA(&this->_yw,iVar9,pRVar4,pRVar3);
      uVar11 = uVar11 + 1;
      ppRVar5 = ppRVar5 + 1;
    } while (uVar7 != uVar11);
  }
  else {
    if (scanLine != iVar9) {
      uVar7 = 0x1d;
      if ((ulong)d < 0x1d) {
        uVar7 = (ulong)d;
      }
      lVar10 = uVar7 + 1;
      y = (scanLine - (int)uVar7) + 0xf;
      puVar6 = (undefined8 *)((long)this + (0x150 - (ulong)(uint)((int)uVar7 << 3)));
      do {
        readYCAScanLine(this,y,(Rgba *)*puVar6);
        lVar10 = lVar10 + -1;
        y = y + 1;
        puVar6 = puVar6 + 1;
      } while (1 < lVar10);
    }
    if (scanLine != iVar9) {
      uVar8 = 3;
      if ((int)d < 3) {
        uVar8 = d;
      }
      ppRVar5 = this->_buf2 + 2;
      lVar10 = 2;
      do {
        if (((int)lVar10 + scanLine & 1U) == 0) {
          RgbaYca::reconstructChromaVert(this->_width,ppRVar5 + -0x1d,*ppRVar5);
          iVar9 = this->_width;
          pRVar3 = *ppRVar5;
          pRVar4 = pRVar3;
        }
        else {
          iVar9 = this->_width;
          pRVar4 = ppRVar5[-0x10];
          pRVar3 = *ppRVar5;
        }
        RgbaYca::YCAtoRGBA(&this->_yw,iVar9,pRVar4,pRVar3);
        lVar10 = lVar10 + -1;
        ppRVar5 = ppRVar5 + -1;
      } while ((int)(2 - uVar8) < lVar10);
    }
  }
  RgbaYca::fixSaturation(&this->_yw,this->_width,this->_buf2,this->_tmpBuf);
  if (0 < this->_width) {
    pRVar3 = this->_fbBase;
    lVar10 = 0;
    do {
      pRVar3[(this->_xMin + lVar10) * this->_fbXStride + this->_fbYStride * (long)scanLine] =
           this->_tmpBuf[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->_width);
  }
  this->_currentScanLine = scanLine;
  return;
}

Assistant:

void
RgbaInputFile::FromYca::readPixels (int scanLine)
{
    if (_fbBase == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "No frame buffer was specified as the "
            "pixel data destination for image file "
            "\"" << _inputPart.fileName ()
                 << "\".");
    }

    //
    // In order to convert one scan line to RGB format, we need that
    // scan line plus N2+1 extra scan lines above and N2+1 scan lines
    // below in luminance/chroma format.
    //
    // We allow random access to scan lines, but we buffer partially
    // processed luminance/chroma data in order to make reading pixels
    // in increasing y or decreasing y order reasonably efficient:
    //
    //	_currentScanLine	holds the y coordinate of the scan line
    //				that was most recently read.
    //
    //	_buf1			contains scan lines _currentScanLine-N2-1
    //				through _currentScanLine+N2+1 in
    //				luminance/chroma format.  Odd-numbered
    //				lines contain no chroma data.  Even-numbered
    //				lines have valid chroma data for all pixels.
    //
    //  _buf2			contains scan lines _currentScanLine-1
    //  			through _currentScanLine+1, in RGB format.
    //				Super-saturated pixels (see ImfRgbaYca.h)
    //				have not yet been eliminated.
    //
    // If the scan line we are trying to read now is close enough to
    // _currentScanLine, we don't have to recompute the contents of _buf1
    // and _buf2 from scratch.  We can rotate _buf1 and _buf2, and fill
    // in the missing data.
    //

    int dy = scanLine - _currentScanLine;

    if (abs (dy) < N + 2) rotateBuf1 (dy);

    if (abs (dy) < 3) rotateBuf2 (dy);

    if (dy < 0)
    {
        {
            int n    = min (-dy, N + 2);
            int yMin = scanLine - N2 - 1;

            for (int i = n - 1; i >= 0; --i)
                readYCAScanLine (yMin + i, _buf1[i]);
        }

        {
            int n = min (-dy, 3);

            for (int i = 0; i < n; ++i)
            {
                if ((scanLine + i) & 1)
                {
                    YCAtoRGBA (_yw, _width, _buf1[N2 + i], _buf2[i]);
                }
                else
                {
                    reconstructChromaVert (_width, _buf1 + i, _buf2[i]);
                    YCAtoRGBA (_yw, _width, _buf2[i], _buf2[i]);
                }
            }
        }
    }
    else
    {
        {
            int n    = min (dy, N + 2);
            int yMax = scanLine + N2 + 1;

            for (int i = n - 1; i >= 0; --i)
                readYCAScanLine (yMax - i, _buf1[N + 1 - i]);
        }

        {
            int n = min (dy, 3);

            for (int i = 2; i > 2 - n; --i)
            {
                if ((scanLine + i) & 1)
                {
                    YCAtoRGBA (_yw, _width, _buf1[N2 + i], _buf2[i]);
                }
                else
                {
                    reconstructChromaVert (_width, _buf1 + i, _buf2[i]);
                    YCAtoRGBA (_yw, _width, _buf2[i], _buf2[i]);
                }
            }
        }
    }

    fixSaturation (_yw, _width, _buf2, _tmpBuf);

    intptr_t base = reinterpret_cast<intptr_t> (_fbBase);
    for (int i = 0; i < _width; ++i)
    {
        Rgba* ptr = reinterpret_cast<Rgba*> (
            base +
            sizeof (Rgba) * (_fbYStride * scanLine + _fbXStride * (i + _xMin)));
        *ptr = _tmpBuf[i];
    }
    _currentScanLine = scanLine;
}